

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char> __thiscall
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>
          (detail *this,basic_appender<char> out,unsigned___int128 value,uint prefix,
          format_specs *specs,digit_grouping<char> *grouping)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  undefined1 n_00 [16];
  undefined1 value_01 [16];
  undefined1 n_01 [16];
  undefined1 value_02 [16];
  undefined1 n_02 [16];
  undefined1 value_03 [16];
  make_unsigned_t<int> mVar1;
  int iVar2;
  int value_04;
  undefined4 in_register_00000014;
  digit_grouping<char> *in_R9;
  undefined8 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  uint local_414;
  char local_3f9;
  char local_3d9;
  anon_class_24_3_e2c60416 local_3b0;
  buffer<char> *local_398;
  uint local_390;
  undefined4 local_38c;
  uint size;
  buffer<char> *local_380;
  buffer<char> *local_378;
  long local_370;
  basic_appender<char> local_360;
  buffer<char> *local_358;
  long local_350;
  buffer<char> *local_340;
  buffer<char> *local_338;
  long local_330;
  basic_appender<char> local_320;
  buffer<char> *local_318;
  long local_310;
  buffer<char> *local_300;
  buffer<char> *local_2f8;
  long local_2f0;
  basic_appender<char> local_2e0;
  buffer<char> *local_2d8;
  long local_2d0;
  format_decimal_result<fmt::v11::basic_appender<char>_> local_2c8;
  buffer<char> *local_2b8;
  long local_2b0;
  basic_appender<char> local_2a0;
  buffer<char> *local_298;
  long local_290;
  allocator<char> local_271;
  undefined1 local_270 [8];
  memory_buffer buffer;
  int num_digits;
  digit_grouping<char> *grouping_local;
  format_specs *specs_local;
  char cStack_38;
  uint prefix_local;
  unsigned___int128 value_local;
  long local_20;
  basic_appender<char> local_18;
  basic_appender<char> out_local;
  
  value_local._0_8_ = CONCAT44(in_register_00000014,prefix);
  specs_local._4_4_ = (uint)specs;
  buffer._532_4_ = 0;
  _cStack_38 = out.buffer_;
  value_local._8_8_ = out.buffer_;
  local_20 = (long)value_local;
  local_18.buffer_ = (buffer<char> *)this;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_270,&local_271);
  std::allocator<char>::~allocator(&local_271);
  switch((char)(grouping->grouping_)._M_string_length) {
  case '\0':
  case '\x03':
    local_290 = (long)value_local;
    local_298 = _cStack_38;
    n._8_4_ = in_stack_fffffffffffffbe0;
    n._0_8_ = in_stack_fffffffffffffbd8;
    n._12_4_ = in_stack_fffffffffffffbe4;
    buffer._532_4_ = count_digits((detail *)_cStack_38,(uint128_opt)n);
    basic_appender<char>::basic_appender(&local_2a0,(buffer<char> *)local_270);
    local_2b0 = (long)value_local;
    local_2b8 = _cStack_38;
    value_00._8_4_ = in_stack_fffffffffffffbe0;
    value_00._0_8_ = in_stack_fffffffffffffbd8;
    value_00._12_4_ = in_stack_fffffffffffffbe4;
    local_2c8 = format_decimal<char,_unsigned___int128,_fmt::v11::basic_appender<char>,_0>
                          ((detail *)local_2a0.buffer_,_cStack_38,(unsigned___int128)value_00,
                           (int)(long)value_local);
    break;
  default:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tgsm[P]heliage/dependencies/fmt/include/fmt/format.h"
                ,0x80e,"");
  case '\x04':
    if ((*(ushort *)((long)&(grouping->grouping_)._M_string_length + 1) >> 8 & 1) != 0) {
      local_3d9 = 'X';
      if ((*(ushort *)((long)&(grouping->grouping_)._M_string_length + 1) >> 7 & 1) == 0) {
        local_3d9 = 'x';
      }
      prefix_append((uint *)((long)&specs_local + 4),(int)local_3d9 << 8 | 0x30);
    }
    local_2d0 = (long)value_local;
    local_2d8 = _cStack_38;
    n_00._8_4_ = in_stack_fffffffffffffbe0;
    n_00._0_8_ = in_stack_fffffffffffffbd8;
    n_00._12_4_ = in_stack_fffffffffffffbe4;
    buffer._532_4_ = count_digits<4,unsigned__int128>((detail *)_cStack_38,(unsigned___int128)n_00);
    basic_appender<char>::basic_appender(&local_2e0,(buffer<char> *)local_270);
    local_2f0 = (long)value_local;
    local_2f8 = _cStack_38;
    value_01._8_4_ = in_stack_fffffffffffffbe0;
    value_01._0_8_ = in_stack_fffffffffffffbd8;
    value_01._12_4_ = in_stack_fffffffffffffbe4;
    local_300 = (buffer<char> *)
                format_uint<4u,char,fmt::v11::basic_appender<char>,unsigned__int128>
                          (local_2e0,(unsigned___int128)value_01,(int)_cStack_38,
                           SUB81((long)value_local,0));
    break;
  case '\x05':
    local_310 = (long)value_local;
    local_318 = _cStack_38;
    n_01._8_4_ = in_stack_fffffffffffffbe0;
    n_01._0_8_ = in_stack_fffffffffffffbd8;
    n_01._12_4_ = in_stack_fffffffffffffbe4;
    buffer._532_4_ = count_digits<3,unsigned__int128>((detail *)_cStack_38,(unsigned___int128)n_01);
    if ((((*(ushort *)((long)&(grouping->grouping_)._M_string_length + 1) >> 8 & 1) != 0) &&
        (*(int *)((long)&(grouping->grouping_)._M_dataplus._M_p + 4) <= (int)buffer._532_4_)) &&
       (_cStack_38 != (buffer<char> *)0x0 || (long)value_local != 0)) {
      prefix_append((uint *)((long)&specs_local + 4),0x30);
    }
    basic_appender<char>::basic_appender(&local_320,(buffer<char> *)local_270);
    local_330 = (long)value_local;
    local_338 = _cStack_38;
    value_02._8_4_ = in_stack_fffffffffffffbe0;
    value_02._0_8_ = in_stack_fffffffffffffbd8;
    value_02._12_4_ = in_stack_fffffffffffffbe4;
    local_340 = (buffer<char> *)
                format_uint<3u,char,fmt::v11::basic_appender<char>,unsigned__int128>
                          (local_320,(unsigned___int128)value_02,(int)_cStack_38,
                           SUB81((long)value_local,0));
    break;
  case '\x06':
    if ((*(ushort *)((long)&(grouping->grouping_)._M_string_length + 1) >> 8 & 1) != 0) {
      local_3f9 = 'B';
      if ((*(ushort *)((long)&(grouping->grouping_)._M_string_length + 1) >> 7 & 1) == 0) {
        local_3f9 = 'b';
      }
      prefix_append((uint *)((long)&specs_local + 4),(int)local_3f9 << 8 | 0x30);
    }
    local_350 = (long)value_local;
    local_358 = _cStack_38;
    n_02._8_4_ = in_stack_fffffffffffffbe0;
    n_02._0_8_ = in_stack_fffffffffffffbd8;
    n_02._12_4_ = in_stack_fffffffffffffbe4;
    buffer._532_4_ = count_digits<1,unsigned__int128>((detail *)_cStack_38,(unsigned___int128)n_02);
    basic_appender<char>::basic_appender(&local_360,(buffer<char> *)local_270);
    local_370 = (long)value_local;
    local_378 = _cStack_38;
    value_03._8_4_ = in_stack_fffffffffffffbe0;
    value_03._0_8_ = in_stack_fffffffffffffbd8;
    value_03._12_4_ = in_stack_fffffffffffffbe4;
    local_380 = (buffer<char> *)
                format_uint<1u,char,fmt::v11::basic_appender<char>,unsigned__int128>
                          (local_360,(unsigned___int128)value_03,(int)_cStack_38,
                           SUB81((long)value_local,0));
    break;
  case '\a':
    _size = local_18.buffer_;
    out_local = write_char<char,fmt::v11::basic_appender<char>>
                          (local_18,cStack_38,(format_specs *)grouping);
    goto LAB_00152efb;
  }
  if (specs_local._4_4_ == 0) {
    local_414 = 0;
  }
  else {
    local_414 = specs_local._4_4_ >> 0x18;
  }
  mVar1 = to_unsigned<int>(buffer._532_4_);
  iVar2 = local_414 + mVar1;
  value_04 = digit_grouping<char>::count_separators(in_R9,buffer._532_4_);
  mVar1 = to_unsigned<int>(value_04);
  local_390 = iVar2 + mVar1;
  local_398 = local_18.buffer_;
  local_3b0.prefix = (uint *)((long)&specs_local + 4);
  local_3b0.buffer = (memory_buffer *)local_270;
  out_local = write_padded<char,(fmt::v11::align::type)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>(fmt::v11::basic_appender<char>,unsigned__int128,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                        (local_18,(format_specs *)grouping,(ulong)local_390,(ulong)local_390,
                         &local_3b0);
LAB_00152efb:
  local_38c = 1;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_270);
  return (basic_appender<char>)out_local.buffer_;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  default:
    FMT_ASSERT(false, "");
    FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt)
      prefix_append(prefix, unsigned(specs.upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, specs.upper);
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt)
      prefix_append(prefix, unsigned(specs.upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}